

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

void __thiscall asmjit::CodeEmitter::CodeEmitter(CodeEmitter *this,uint32_t type)

{
  undefined1 in_SIL;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__CodeEmitter_00290a28;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0xf) = 0;
  in_RDI[2] = 0xffffffffffffffff;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined1 *)(in_RDI + 5) = in_SIL;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 6;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 7) = 1;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  memset(in_RDI + 8,0,8);
  in_RDI[9] = 0;
  memset(in_RDI + 10,0,0x10);
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  return;
}

Assistant:

CodeEmitter::CodeEmitter(uint32_t type) noexcept
  : _codeInfo(),
    _code(nullptr),
    _nextEmitter(nullptr),
    _type(static_cast<uint8_t>(type)),
    _destroyed(false),
    _finalized(false),
    _reserved(false),
    _lastError(kErrorNotInitialized),
    _privateData(0),
    _globalHints(0),
    _globalOptions(kOptionMaybeFailureCase),
    _options(0),
    _extraReg(),
    _inlineComment(nullptr),
    _none(),
    _nativeGpReg(),
    _nativeGpArray(nullptr) {}